

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkFnc
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeFnc *pnode,Context context)

{
  bool bVar1;
  ResultType RVar2;
  ParseNodeParamPattern *pPVar3;
  ParseNodeVar *pPVar4;
  ResultType local_41;
  ParseNode *local_38;
  ParseNodePtr argNode;
  ResultType result;
  Context context_local;
  ParseNodeFnc *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  local_38 = pnode->pnodeParams;
  while( true ) {
    if (local_38 == (ParseNode *)0x0) {
      if (pnode->pnodeRest != (ParseNodePtr)0x0) {
        RVar2 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkSecondChild
                          ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                           pnode->pnodeRest,context);
        bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                          (&this->super_WalkerPolicyTest,RVar2);
        if (!bVar1) {
          return RVar2;
        }
      }
      argNode._7_1_ =
           WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                     ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                      &pnode->super_ParseNode,context);
      bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                        (&this->super_WalkerPolicyTest,argNode._7_1_);
      if (bVar1) {
        argNode._7_1_ =
             WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                       ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                        &pnode->super_ParseNode,pnode->pnodeBody,context);
      }
      return argNode._7_1_;
    }
    if (local_38 == pnode->pnodeParams) {
      local_41 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            local_38,context);
    }
    else {
      local_41 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            &pnode->super_ParseNode,local_38,context);
    }
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,local_41);
    if (!bVar1) break;
    if (local_38->nop == knopParamPattern) {
      pPVar3 = ParseNode::AsParseNodeParamPattern(local_38);
      local_38 = pPVar3->pnodeNext;
    }
    else {
      pPVar4 = ParseNode::AsParseNodeVar(local_38);
      local_38 = pPVar4->pnodeNext;
    }
  }
  return local_41;
}

Assistant:

ResultType WalkFnc(ParseNodeFnc *pnode, Context context)
    {
        ResultType result;
        // For ordering, arguments are considered prior to the function and the body after.
        ParseNodePtr argNode = pnode->pnodeParams;
        while (argNode)
        {
            result = argNode == pnode->pnodeParams ? WalkFirstChild(argNode, context) : WalkNthChild(pnode, argNode, context);
            if (!ContinueWalk(result)) return result;
            if (argNode->nop == knopParamPattern)
            {
                argNode = argNode->AsParseNodeParamPattern()->pnodeNext;
            }
            else
            {
                argNode = argNode->AsParseNodeVar()->pnodeNext;
            }
        }

        if (pnode->pnodeRest != nullptr)
        {
            result = WalkSecondChild(pnode->pnodeRest, context);
            if (!ContinueWalk(result))  return result;
        }

        result = WalkNode(pnode, context);
        if (ContinueWalk(result)) result = WalkNthChild(pnode, pnode->pnodeBody, context);
        return result;
    }